

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  uint uVar1;
  iterator Position;
  bool bVar2;
  iterator pcVar3;
  iterator pcVar4;
  uint MaxAllSpaceLineCharacters;
  uint uVar5;
  iterator unaff_R14;
  Twine local_68;
  uint *local_50;
  uint *local_48;
  uint local_3c;
  bool *local_38;
  
  uVar5 = 0;
  local_50 = LineBreaks;
  local_48 = BlockIndent;
  local_3c = BlockExitIndent;
  local_38 = IsDone;
  while( true ) {
    advanceWhile(this,(SkipWhileFunc)skip_s_space);
    pcVar3 = skip_nb_char(this,this->Current);
    Position = this->Current;
    if (pcVar3 != Position) break;
    pcVar4 = skip_b_break(this,Position);
    uVar1 = this->Column;
    if (this->Column <= uVar5) {
      uVar1 = uVar5;
      Position = unaff_R14;
    }
    if (pcVar4 != pcVar3) {
      uVar5 = uVar1;
      unaff_R14 = Position;
    }
    if ((pcVar3 == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2))
    goto LAB_00dc93c3;
    *local_50 = *local_50 + 1;
  }
  uVar1 = this->Column;
  if (local_3c < uVar1) {
    *local_48 = uVar1;
    bVar2 = true;
    if (uVar1 < uVar5) {
      Twine::Twine(&local_68,"Leading all-spaces line must be smaller than the block indent");
      setError(this,&local_68,unaff_R14);
      bVar2 = false;
    }
  }
  else {
LAB_00dc93c3:
    *local_38 = true;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}